

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psist.c
# Opt level: O0

int test_psist_file(void)

{
  int iVar1;
  char *pcVar2;
  QcPsist *qTbl;
  size_t sVar3;
  QcMessage *pQVar4;
  QcQueue *queue_00;
  QcMessage *message1;
  int i_1;
  QcQueue *queue;
  QcMessage *message;
  int i;
  QcPsist *qPsist;
  char descript [512];
  char *cwd;
  char buf [256];
  undefined1 local_110 [4];
  int ret;
  QcErr err;
  
  memset(&cwd,0,0x100);
  pcVar2 = qc_dir_getcwd((char *)&cwd,0x100);
  memset(&qPsist,0,0x200);
  sprintf((char *)&qPsist,"file://%s/%s",pcVar2,filename);
  qTbl = qc_psist_open(0x400,10000,(char *)&qPsist,(QcErr *)local_110);
  if (qTbl == (QcPsist *)0x0) {
    printf("open psist failed.\n");
    err.desc[0xf8] = -1;
    err.desc[0xf9] = -1;
    err.desc[0xfa] = -1;
    err.desc[0xfb] = -1;
  }
  else {
    for (message._4_4_ = 0; pcVar2 = buff, message._4_4_ < 1000; message._4_4_ = message._4_4_ + 1)
    {
      sVar3 = strlen(buff);
      pQVar4 = qc_message_create(pcVar2,(int)sVar3,2);
      buf._252_4_ = qc_psist_append(qTbl,pQVar4,(QcErr *)local_110);
      if (buf._252_4_ != 0) {
        printf("psist append failed.\n");
        return -1;
      }
      qc_message_release(pQVar4);
    }
    queue_00 = qc_queue_create(10000,10,(QcErr *)0x0);
    buf._252_4_ = qc_psist_loadqueue(qTbl,queue_00,(QcErr *)local_110);
    if (buf._252_4_ == 0) {
      buf[0xfc] = '\0';
      buf[0xfd] = '\0';
      buf[0xfe] = '\0';
      buf[0xff] = '\0';
      for (message1._4_4_ = 0; message1._4_4_ < 1000; message1._4_4_ = message1._4_4_ + 1) {
        pQVar4 = qc_queue_msgget(queue_00,1,(QcErr *)0x0);
        if (pQVar4 == (QcMessage *)0x0) {
          printf("qc_queue_msgget failed.\n");
          return -1;
        }
        qc_message_release(pQVar4);
      }
      qc_psist_close(qTbl);
      err.desc[0xf8] = '\0';
      err.desc[0xf9] = '\0';
      err.desc[0xfa] = '\0';
      err.desc[0xfb] = '\0';
    }
    else {
      printf("load queue failed.\n");
      err.desc[0xf8] = -1;
      err.desc[0xf9] = -1;
      err.desc[0xfa] = -1;
      err.desc[0xfb] = -1;
    }
  }
  iVar1._0_1_ = err.desc[0xf8];
  iVar1._1_1_ = err.desc[0xf9];
  iVar1._2_1_ = err.desc[0xfa];
  iVar1._3_1_ = err.desc[0xfb];
  return iVar1;
}

Assistant:

int test_psist_file()
{
	QcErr err;
	int ret;

	char buf[256];
	memset(buf, 0, sizeof(buf));

	char* cwd = qc_dir_getcwd(buf, sizeof(buf));

	char descript[512];
	memset(descript, 0, sizeof(descript));
	sprintf(descript, "file://%s/%s", cwd, filename);


	QcPsist *qPsist = qc_psist_open(MSG_BUFF_SIZE, MSG_COUNT_LIMIT, descript, &err);
	if (!qPsist) {
		printf("open psist failed.\n");
		return -1;
	}

	for (int i = 0; i < 1000; i++) {
		QcMessage *message = qc_message_create(buff, (int)strlen(buff), BUFFFLAG_NO_FREE);
		ret = qc_psist_append(qPsist, message, &err);
		if (0 != ret) {
			printf("psist append failed.\n");
			return -1;
		}
		qc_message_release(message);
	}

	QcQueue* queue = qc_queue_create(MSG_COUNT_LIMIT, 10, NULL);
	ret = qc_psist_loadqueue(qPsist, queue, &err);
	if (0 != ret) {
		printf("load queue failed.\n");
		return -1;
	}

	for (int i = 0; i < 1000; i++) {
		QcMessage *message1 = qc_queue_msgget(queue, 1, NULL);
		if (NULL == message1) {
			printf("qc_queue_msgget failed.\n");
			return -1;
		}

		//printf("msg:%s\n", qc_message_buff(message1));
		qc_message_release(message1);
	}

	qc_psist_close(qPsist);

	return 0;
}